

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void m68000_cpu_initfn(CPUState *obj)

{
  CPUM68KState_conflict *env_00;
  CPUM68KState_conflict *env;
  M68kCPU *cpu;
  CPUState *obj_local;
  
  env_00 = (CPUM68KState_conflict *)(obj[1].tb_jmp_cache + 0x8f);
  m68k_set_feature(env_00,0);
  m68k_set_feature(env_00,0xd);
  m68k_set_feature(env_00,0xf);
  m68k_set_feature(env_00,0x1a);
  return;
}

Assistant:

static void m68000_cpu_initfn(CPUState *obj)
{
    M68kCPU *cpu = M68K_CPU(obj);
    CPUM68KState *env = &cpu->env;

    m68k_set_feature(env, M68K_FEATURE_M68000);
    m68k_set_feature(env, M68K_FEATURE_USP);
    m68k_set_feature(env, M68K_FEATURE_WORD_INDEX);
    m68k_set_feature(env, M68K_FEATURE_MOVEP);
}